

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O3

void ggml::cpu::aarch64::gemv<block_q4_0,8l,4l,(ggml_type)8>
               (int n,float *s,size_t bs,void *vx,void *vy,int nr,int nc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float *pfVar3;
  int iVar4;
  ulong *puVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float sumf [4];
  
  if (3 < nc) {
    auVar7[8] = 0xf0;
    auVar7._0_8_ = 0xf0f0f0f0f0f0f0f0;
    auVar7[9] = 0xf0;
    auVar7[10] = 0xf0;
    auVar7[0xb] = 0xf0;
    auVar7[0xc] = 0xf0;
    auVar7[0xd] = 0xf0;
    auVar7[0xe] = 0xf0;
    auVar7[0xf] = 0xf0;
    puVar5 = (ulong *)((long)vx + 8);
    iVar4 = n + 0x1f;
    if (-1 < n) {
      iVar4 = n;
    }
    uVar6 = 0;
    do {
      if (0x1f < n) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = *(ulong *)((long)vy + 0x12);
        vpmovsxbd_avx2(auVar1);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = *(ulong *)((long)vy + 2);
        vpmovsxbd_avx2(auVar2);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = *puVar5;
        vpand_avx(auVar8,auVar7);
        halt_baddata();
      }
      pfVar3 = s + uVar6 * 4;
      uVar6 = uVar6 + 1;
      puVar5 = puVar5 + (long)(iVar4 >> 5) * 9;
      pfVar3[0] = 0.0;
      pfVar3[1] = 0.0;
      pfVar3[2] = 0.0;
      pfVar3[3] = 0.0;
    } while (uVar6 != (uint)nc >> 2);
  }
  return;
}

Assistant:

void gemv<block_q4_0, 8, 4, GGML_TYPE_Q8_0>(int n, float * s, size_t bs, const void * vx, const void * vy, int nr, int nc) {
    ggml_gemv_q4_0_4x8_q8_0(n, s, bs, vx, vy, nr, nc);
}